

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

void __thiscall
Js::JSONStringifier::SetNumericProperty
          (JSONStringifier *this,double value,Var valueVar,JSONProperty *prop)

{
  char *addr;
  uint uVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  JavascriptString *pJVar5;
  
  bVar2 = NumberUtilities::IsFinite(value);
  if (bVar2) {
    prop->type = Number;
    Memory::Recycler::WBSetBit((char *)&(prop->field_1).obj);
    (prop->field_1).numericValue.value.ptr = valueVar;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&prop->field_1);
    pJVar5 = JavascriptConversion::ToString(valueVar,this->scriptContext);
    addr = (char *)((long)&prop->field_1 + 8);
    Memory::Recycler::WBSetBit(addr);
    (prop->field_1).numericValue.string.ptr = pJVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    uVar1 = this->totalStringLength;
    cVar3 = JavascriptString::GetLength((prop->field_1).numericValue.string.ptr);
    cVar4 = cVar3 + uVar1;
    if (!CARRY4(cVar3,uVar1)) {
LAB_00b76868:
      this->totalStringLength = cVar4;
      return;
    }
  }
  else {
    prop->type = Null;
    if (this->totalStringLength < 0xfffffffc) {
      cVar4 = this->totalStringLength + 4;
      goto LAB_00b76868;
    }
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

void
JSONStringifier::SetNumericProperty(double value, _In_ Var valueVar, _Out_ JSONProperty* prop)
{
    if (NumberUtilities::IsFinite(value))
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = valueVar;
        prop->numericValue.string = JavascriptConversion::ToString(valueVar, this->scriptContext);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
    }
    else
    {
        this->SetNullProperty(prop);
    }
}